

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_reselect(_glist *x)

{
  t_selection *ptVar1;
  t_gobj *y;
  t_gobj *ptVar2;
  
  ptVar1 = x->gl_editor->e_selection;
  if (x->gl_editor->e_textedfor == (_rtext *)0x0) {
    if ((ptVar1 != (t_selection *)0x0) && (ptVar1->sel_next == (_selection *)0x0)) {
      gobj_activate(ptVar1->sel_what,x,1);
      return;
    }
  }
  else {
    ptVar2 = ptVar1->sel_what;
    if ((ptVar2 != (t_gobj *)0x0) && (ptVar1->sel_next == (_selection *)0x0)) {
      canvas_getindex(x,ptVar2);
      glist_noselect(x);
      for (y = x->gl_list; y != (t_gobj *)0x0; y = y->g_next) {
        if (y == ptVar2) {
          glist_select(x,y);
          return;
        }
      }
      for (ptVar2 = x->gl_list; ptVar2 != (t_gobj *)0x0; ptVar2 = ptVar2->g_next) {
        if (ptVar2->g_next == (_gobj *)0x0) {
          glist_select(x,ptVar2);
        }
      }
    }
  }
  return;
}

Assistant:

static void canvas_reselect(t_canvas *x)
{
    t_gobj *g, *gwas;
        /* if someone is text editing, and if only one object is
           selected,  deselect everyone and reselect.  */
    if (x->gl_editor->e_textedfor)
    {
            /* only do this if exactly one item is selected. */
        if ((gwas = x->gl_editor->e_selection->sel_what) &&
            !x->gl_editor->e_selection->sel_next)
        {
            int nobjwas = glist_getindex(x, 0),
                indx = canvas_getindex(x, x->gl_editor->e_selection->sel_what);
            glist_noselect(x);
            for (g = x->gl_list; g; g = g->g_next)
                if (g == gwas)
                {
                    glist_select(x, g);
                    return;
                }
                /* "gwas" must have disappeared; just search to the last
                   object and select it */
            for (g = x->gl_list; g; g = g->g_next)
                if (!g->g_next)
                    glist_select(x, g);
        }
    }
    else if (x->gl_editor->e_selection &&
             !x->gl_editor->e_selection->sel_next)
            /* otherwise activate first item in selection */
        gobj_activate(x->gl_editor->e_selection->sel_what, x, 1);
}